

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireHandWithOneCardTest_ignoreSomeOperationsIfGameFinished_Test::TestBody
          (SolitaireHandWithOneCardTest_ignoreSomeOperationsIfGameFinished_Test *this)

{
  FunctionMocker<void_()> *this_00;
  StrictMock<solitaire::archivers::MoveCardsOperationSnapshotCreatorMock> *mock_obj;
  TypedExpectation<void_()> *this_01;
  TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)> *this_02;
  TypedExpectation<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  *this_03;
  Solitaire *this_04;
  MockSpec<void_(std::optional<solitaire::cards::Card>_&)> local_58;
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
  local_38;
  PileId local_20;
  PileId local_1c;
  
  SolitaireEmptyHandTest::finishGame((SolitaireEmptyHandTest *)this);
  mock_obj = (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.moveCardsOperationSnapshotCreatorMock.rawPointer;
  this_00 = &(mock_obj->super_MoveCardsOperationSnapshotCreatorMock).gmock00_restoreSourcePile_18;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj);
  local_58.function_mocker_ =
       (FunctionMocker<void_(std::optional<solitaire::cards::Card>_&)> *)this_00;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_()>::InternalExpectedAt
                      ((MockSpec<void_()> *)&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x1c2,"*moveCardsOperationSnapshotCreatorMock","restoreSourcePile()");
  testing::internal::TypedExpectation<void_()>::Times(this_01,0);
  local_38.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<std::optional<solitaire::cards::Card>&>::
       GetVTable<testing::internal::MatcherBase<std::optional<solitaire::cards::Card>&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0031bce0;
  piles::FoundationPileMock::gmock_tryAddCard
            (&local_58,
             (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.lastFoundationPileMock,
             (Matcher<std::optional<solitaire::cards::Card>_&> *)&local_38);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(std::optional<solitaire::cards::Card>_&)>::
            InternalExpectedAt(&local_58,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                               ,0x1c3,"lastFoundationPileMock","tryAddCard(_)");
  testing::internal::TypedExpectation<void_(std::optional<solitaire::cards::Card>_&)>::Times
            (this_02,0);
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase
            ((MatcherBase<std::optional<solitaire::cards::Card>_&> *)&local_58.matchers_);
  testing::internal::MatcherBase<std::optional<solitaire::cards::Card>_&>::~MatcherBase
            ((MatcherBase<std::optional<solitaire::cards::Card>_&> *)&local_38);
  local_38.vtable_ =
       (VTable *)
       testing::internal::
       MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>::
       GetVTable<testing::internal::MatcherBase<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0031bfc8;
  piles::TableauPileMock::gmock_tryAddCards
            ((MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
              *)&local_58,
             (this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.lastTableauPileMock,
             (Matcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
              *)&local_38);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::
            MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
                        *)&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                       ,0x1c4,"lastTableauPileMock","tryAddCards(_)");
  testing::internal::
  TypedExpectation<void_(std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&)>
  ::Times(this_03,0);
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase((MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>
                *)&local_58.matchers_);
  testing::internal::
  MatcherBase<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_&>::
  ~MatcherBase(&local_38);
  this_04 = &(this->super_SolitaireHandWithOneCardTest).super_SolitaireEmptyHandTest.
             super_SolitaireTest.solitaire;
  Solitaire::tryPutCardsBackFromHand(this_04);
  local_1c.t = (anonymous_namespace)::lastFoundationPileId;
  Solitaire::tryAddCardOnFoundationPile(this_04,&local_1c);
  local_20.t = (anonymous_namespace)::lastTableauPileId;
  Solitaire::tryAddCardsOnTableauPile(this_04,&local_20);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardTest, ignoreSomeOperationsIfGameFinished) {
    finishGame();

    EXPECT_CALL(*moveCardsOperationSnapshotCreatorMock, restoreSourcePile()).Times(0);
    EXPECT_CALL(lastFoundationPileMock, tryAddCard(_)).Times(0);
    EXPECT_CALL(lastTableauPileMock, tryAddCards(_)).Times(0);

    solitaire.tryPutCardsBackFromHand();
    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    solitaire.tryAddCardsOnTableauPile(lastTableauPileId);
}